

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_str_getcsv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_54;
  int local_50;
  int i;
  int nLen;
  int escape;
  int encl;
  int delim;
  jx9_value *pArray;
  char *zPtr;
  char *zInput;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  escape = 0x2c;
  nLen = 0x22;
  i = 0x5c;
  zInput = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_null(pjStack_18);
  }
  else {
    zPtr = jx9_value_to_string(*(jx9_value **)zInput,&local_50);
    if (1 < apArg_local._4_4_) {
      iVar1 = jx9_value_is_string(*(jx9_value **)(zInput + 8));
      if ((iVar1 != 0) &&
         (pArray = (jx9_value *)jx9_value_to_string(*(jx9_value **)(zInput + 8),&local_54),
         0 < local_54)) {
        escape = (int)*(char *)&pArray->x;
      }
      if (2 < apArg_local._4_4_) {
        iVar1 = jx9_value_is_string(*(jx9_value **)(zInput + 0x10));
        if ((iVar1 != 0) &&
           (pArray = (jx9_value *)jx9_value_to_string(*(jx9_value **)(zInput + 0x10),&local_54),
           0 < local_54)) {
          nLen = (int)*(char *)&pArray->x;
        }
        if (((3 < apArg_local._4_4_) &&
            (iVar1 = jx9_value_is_string(*(jx9_value **)(zInput + 0x18)), iVar1 != 0)) &&
           (pArray = (jx9_value *)jx9_value_to_string(*(jx9_value **)(zInput + 0x18),&local_54),
           0 < local_54)) {
          i = (int)*(char *)&pArray->x;
        }
      }
    }
    _encl = jx9_context_new_array(pjStack_18);
    if (_encl == (jx9_value *)0x0) {
      jx9_context_throw_error(pjStack_18,1,"JX9 is running out of memory");
      jx9_result_null(pjStack_18);
    }
    else {
      jx9ProcessCsv(zPtr,local_50,escape,nLen,i,jx9CsvConsumer,_encl);
      jx9_result_value(pjStack_18,_encl);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_getcsv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zInput, *zPtr;
	jx9_value *pArray;
	int delim  = ',';   /* Delimiter */
	int encl   = '"' ;  /* Enclosure */
	int escape = '\\';  /* Escape character */
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the raw input */
	zInput = jx9_value_to_string(apArg[0], &nLen);
	if( nArg > 1 ){
		int i;
		if( jx9_value_is_string(apArg[1]) ){
			/* Extract the delimiter */
			zPtr = jx9_value_to_string(apArg[1], &i);
			if( i > 0 ){
				delim = zPtr[0];
			}
		}
		if( nArg > 2 ){
			if( jx9_value_is_string(apArg[2]) ){
				/* Extract the enclosure */
				zPtr = jx9_value_to_string(apArg[2], &i);
				if( i > 0 ){
					encl = zPtr[0];
				}
			}
			if( nArg > 3 ){
				if( jx9_value_is_string(apArg[3]) ){
					/* Extract the escape character */
					zPtr = jx9_value_to_string(apArg[3], &i);
					if( i > 0 ){
						escape = zPtr[0];
					}
				}
			}
		}
	}
	/* Create our array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Parse the raw input */
	jx9ProcessCsv(zInput, nLen, delim, encl, escape, jx9CsvConsumer, pArray);
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}